

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O1

void dtl_json_writer_decreaseIndent(dtl_json_writer_t *self)

{
  int iVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  
  iVar1 = self->indentWidth;
  if (0 < iVar1) {
    iVar4 = self->currentIndent - iVar1;
    if (iVar4 == 0 || self->currentIndent < iVar1) {
      iVar4 = 0;
    }
    self->currentIndent = iVar4;
    if (self->indentArray == (adt_bytearray_t *)0x0) {
      __assert_fail("self->indentArray != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                    ,0xe6,"void dtl_json_writer_decreaseIndent(dtl_json_writer_t *)");
    }
    uVar2 = adt_bytearray_length(self->indentArray);
    if ((int)uVar2 <= self->currentIndent) {
      __assert_fail("(int32_t) adt_bytearray_length(self->indentArray) > self->currentIndent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                    ,0xe7,"void dtl_json_writer_decreaseIndent(dtl_json_writer_t *)");
    }
    puVar3 = adt_bytearray_data(self->indentArray);
    puVar3[self->currentIndent] = '\0';
  }
  return;
}

Assistant:

static void dtl_json_writer_decreaseIndent(dtl_json_writer_t *self)
{
   if (self->indentWidth > 0)
   {
      if (self->currentIndent > self->indentWidth)
      {
         self->currentIndent -= self->indentWidth;
      }
      else
      {
         self->currentIndent = 0;
      }
      assert(self->indentArray != 0);
      assert( (int32_t) adt_bytearray_length(self->indentArray) > self->currentIndent);
      adt_bytearray_data(self->indentArray)[self->currentIndent] = 0u;
   }
}